

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

int __thiscall
boost::runtime::
parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
::clone(parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
  *p;
  int iVar1;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  p = (parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
       *)operator_new(0x130);
  parameter((parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
             *)__fn,this);
  iVar1 = (int)this;
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>>
            (in_stack_ffffffffffffffe0,p);
  return iVar1;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new parameter( *this ) );
    }